

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall UI::renderSeparator(UI *this,char *prefix,char *ch,char *suffix,int n,bool disabled)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_register_00000084;
  undefined7 in_register_00000089;
  __va_list_tag _Stack_d8;
  undefined1 auStack_b8 [8];
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  ulong uStack_98;
  undefined8 uStack_90;
  
  uStack_98 = CONCAT44(in_register_00000084,n);
  uVar2 = 0xff;
  if (n < 0xff) {
    uVar2 = n;
  }
  uVar1 = 0;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  if (0 < n) {
    uStack_98 = 0;
    do {
      renderSeparator::buf[uStack_98] = *ch;
      uStack_98 = uStack_98 + 1;
    } while (uVar2 != uStack_98);
  }
  renderSeparator::buf[uVar1] = '\0';
  if (!disabled) {
    _Stack_d8.reg_save_area = auStack_b8;
    pcStack_a8 = renderSeparator::buf;
    uStack_90 = CONCAT71(in_register_00000089,disabled);
    _Stack_d8.overflow_arg_area = &stack0x00000008;
    _Stack_d8.gp_offset = 8;
    _Stack_d8.fp_offset = 0x30;
    pcStack_b0 = prefix;
    pcStack_a0 = suffix;
    ImGui::TextV("%s%s%s",&_Stack_d8);
    return;
  }
  ImGui::TextDisabled("%s%s%s");
  return;
}

Assistant:

void UI::renderSeparator(const char * prefix, const char * ch, const char * suffix, int n, bool disabled) {
    static char buf[256];
    if (n > 255) n = 255;
    if (n < 0) n = 0;
    for (int i = 0; i < n; i++) {
        buf[i] = ch[0];
    }
    buf[n] = 0;
    if (disabled) {
        ImGui::TextDisabled("%s%s%s", prefix, buf, suffix);
    } else {
        ImGui::Text("%s%s%s", prefix, buf, suffix);
    }
}